

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  char *pcVar6;
  Recycler *this;
  char16_t *destString;
  JavascriptString *pJVar7;
  char *pcVar8;
  size_t count;
  uint in_stack_00000010;
  undefined1 local_1a8 [8];
  char defaultLocaleID [157];
  char defaultLangtag [157];
  undefined1 local_60 [8];
  charcount_t defaultLangtag16Actual;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  int local_34 [2];
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a2b2ff;
    *puVar5 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a2b2ff;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00a2b2ff;
    *puVar5 = 0;
  }
  local_34[0] = 0;
  memset(defaultLocaleID + 0x98,0,0x9d);
  memset(local_1a8,0,0x9d);
  iVar4 = uloc_getName_70(0,local_1a8,0x9d,local_34);
  if (local_34[0] == 7) goto LAB_00a2b301;
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (0x9b < iVar4 - 1U) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      pcVar8 = 
      "(localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0))";
      pcVar6 = 
      "localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0)";
      goto LAB_00a2b11b;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    pcVar6 = (char *)u_errorName_70(local_34[0]);
    pcVar8 = "(false)";
LAB_00a2b11b:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x588,pcVar8,pcVar6);
    if (!bVar3) goto LAB_00a2b2ff;
    *puVar5 = 0;
  }
  iVar4 = uloc_toLanguageTag_70(local_1a8,defaultLocaleID + 0x98,0x9d,1,local_34);
  if (local_34[0] == 7) {
LAB_00a2b301:
    Throw::OutOfMemory();
  }
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (0x9b < iVar4 - 1U) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      pcVar8 = 
      "(langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0))";
      pcVar6 = 
      "langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0)";
      goto LAB_00a2b1ff;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    pcVar6 = (char *)u_errorName_70(local_34[0]);
    pcVar8 = "(false)";
LAB_00a2b1ff:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x58b,pcVar8,pcVar6);
    if (!bVar3) goto LAB_00a2b2ff;
    *puVar5 = 0;
  }
  count = (size_t)(iVar4 + 1);
  local_60 = (undefined1  [8])&char16_t::typeinfo;
  _defaultLangtag16Actual = 0;
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
  ;
  local_40 = 0x58d;
  local_50 = count;
  this = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_60);
  destString = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffff00000000);
  utf8::NarrowStringToWideNoAlloc
            (defaultLocaleID + 0x98,(long)iVar4,destString,count,(charcount_t *)local_60);
  if (((ulong)local_60 & 0xffffffff) != (long)iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x590,
                                "(defaultLangtag16Actual == static_cast<size_t>(langtagActual))",
                                "Language tags should always be ASCII");
    if (!bVar3) {
LAB_00a2b2ff:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pJVar7 = JavascriptString::NewWithBuffer(destString,local_60._0_4_,pSVar1);
  return pJVar7;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        char16 defaultLocale[LOCALE_NAME_MAX_LENGTH];
        defaultLocale[0] = '\0';

        if (GetUserDefaultLocaleName(defaultLocale, _countof(defaultLocale)) == 0)
        {
            JavascriptError::MapAndThrowError(scriptContext, HRESULT_FROM_WIN32(GetLastError()));
        }

        return JavascriptString::NewCopySz(defaultLocale, scriptContext);
#else
        UErrorCode status = U_ZERO_ERROR;
        char defaultLangtag[ULOC_FULLNAME_CAPACITY] = { 0 };
        char defaultLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };

        int localeIDActual = uloc_getName(nullptr, defaultLocaleID, _countof(defaultLocaleID), &status);
        ICU_ASSERT(status, localeIDActual > 0 && localeIDActual < _countof(defaultLocaleID));

        int langtagActual = uloc_toLanguageTag(defaultLocaleID, defaultLangtag, _countof(defaultLangtag), true, &status);
        ICU_ASSERT(status, langtagActual > 0 && langtagActual < _countof(defaultLangtag));

        char16 *defaultLangtag16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, langtagActual + 1);
        charcount_t defaultLangtag16Actual = 0;
        utf8::NarrowStringToWideNoAlloc(defaultLangtag, static_cast<size_t>(langtagActual), defaultLangtag16, langtagActual + 1, &defaultLangtag16Actual);
        AssertOrFailFastMsg(defaultLangtag16Actual == static_cast<size_t>(langtagActual), "Language tags should always be ASCII");
        return JavascriptString::NewWithBuffer(defaultLangtag16, defaultLangtag16Actual, scriptContext);
#endif
    }